

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_search_forward(ps_decoder_t *ps)

{
  int iVar1;
  int local_1c;
  int k;
  int nfr;
  ps_decoder_t *ps_local;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x49b,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    ps_local._4_4_ = -1;
  }
  else {
    local_1c = 0;
    while (0 < ps->acmod->n_feat_frame) {
      if ((0 < ps->pl_window) &&
         (iVar1 = (*ps->phone_loop->vt->step)(ps->phone_loop,ps->acmod->output_frame), iVar1 < 0)) {
        return iVar1;
      }
      if ((ps->pl_window <= ps->acmod->output_frame) &&
         (iVar1 = (*ps->search->vt->step)(ps->search,ps->acmod->output_frame - ps->pl_window),
         iVar1 < 0)) {
        return iVar1;
      }
      acmod_advance(ps->acmod);
      ps->n_frame = ps->n_frame + 1;
      local_1c = local_1c + 1;
    }
    ps_local._4_4_ = local_1c;
  }
  return ps_local._4_4_;
}

Assistant:

static int
ps_search_forward(ps_decoder_t *ps)
{
    int nfr;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }
    nfr = 0;
    while (ps->acmod->n_feat_frame > 0) {
        int k;
        if (ps->pl_window > 0)
            if ((k = ps_search_step(ps->phone_loop, ps->acmod->output_frame)) < 0)
                return k;
        if (ps->acmod->output_frame >= ps->pl_window)
            if ((k = ps_search_step(ps->search,
                                    ps->acmod->output_frame - ps->pl_window)) < 0)
                return k;
        acmod_advance(ps->acmod);
        ++ps->n_frame;
        ++nfr;
    }
    return nfr;
}